

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpexternaltransmitter.cpp
# Opt level: O2

void __thiscall jrtplib::RTPExternalTransmitter::FlushPackets(RTPExternalTransmitter *this)

{
  list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_> *this_00;
  _List_node_base *p_Var1;
  
  this_00 = &this->rawpacketlist;
  p_Var1 = (_List_node_base *)this_00;
  while (p_Var1 = (((_List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_> *
                    )&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)this_00) {
    RTPDelete<jrtplib::RTPRawPacket>
              ((RTPRawPacket *)p_Var1[1]._M_next,
               (this->super_RTPTransmitter).super_RTPMemoryObject.mgr);
  }
  std::__cxx11::list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>::clear
            (this_00);
  return;
}

Assistant:

void RTPExternalTransmitter::FlushPackets()
{
	std::list<RTPRawPacket*>::const_iterator it;

	for (it = rawpacketlist.begin() ; it != rawpacketlist.end() ; ++it)
		RTPDelete(*it,GetMemoryManager());
	rawpacketlist.clear();
}